

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_EnergyScan_Test::TestBody(InterpreterTestSuite_PC_EnergyScan_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  TypedExpectation<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  Matcher<unsigned_short> *gmock_a3;
  Expression expr;
  AssertionResult gtest_ar_;
  Value value;
  TestContext ctx;
  Matcher<unsigned_char> local_2d8;
  Matcher<unsigned_short> local_2c0;
  Matcher<unsigned_int> local_2a8;
  Matcher<unsigned_short> local_290;
  undefined1 local_278 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  _Alloc_hider local_250;
  char local_240 [16];
  testing local_230 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_220;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  element_type *local_1f8;
  undefined1 local_1f0 [16];
  _Alloc_hider local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  undefined **local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  undefined **local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190;
  Error local_188;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  local_2a8.super_MatcherBase<unsigned_int>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_2a8.super_MatcherBase<unsigned_int>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a9480;
  local_2a8.super_MatcherBase<unsigned_int>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2aa0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_int_const&>const*>
            (&local_2a8.super_MatcherBase<unsigned_int>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_2a8.super_MatcherBase<unsigned_int>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_2a8.super_MatcherBase<unsigned_int>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2a58;
  local_2d8.super_MatcherBase<unsigned_char>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_2d8.super_MatcherBase<unsigned_char>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a9940;
  local_2d8.super_MatcherBase<unsigned_char>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2b08;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_char_const&>const*>
            (&local_2d8.super_MatcherBase<unsigned_char>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_2d8.super_MatcherBase<unsigned_char>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_2d8.super_MatcherBase<unsigned_char>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2ac0;
  local_2c0.super_MatcherBase<unsigned_short>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_2c0.super_MatcherBase<unsigned_short>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a3618;
  local_2c0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a0a20;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
            (&local_2c0.super_MatcherBase<unsigned_short>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_2c0.super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_2c0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a09d8;
  local_290.super_MatcherBase<unsigned_short>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_290.super_MatcherBase<unsigned_short>.impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a3618;
  local_290.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a0a20;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<unsigned_short_const&>const*>
            (&local_290.super_MatcherBase<unsigned_short>.impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_290.super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_290.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a09d8;
  local_220.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)operator_new(8);
  ((local_220.
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    .impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_003a3560;
  local_220.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003a0858;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<std::__cxx11::string_const&>const*>
            (&local_220.
              super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              .impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             local_220.
             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
             .impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  local_220.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003a0810;
  gmock_a3 = &local_290;
  CommissionerAppMock::gmock_EnergyScan
            ((MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_208,
             local_160.mDefaultCommissionerObject.
             super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&local_2a8,
             &local_2d8,&local_2c0,gmock_a3,&local_220);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::InternalExpectedAt
                      ((MockSpec<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_208,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x85a,"*ctx.mDefaultCommissionerObject","EnergyScan(_, _, _, _, _)");
  paVar1 = &local_188.mMessage.field_2;
  local_188.mCode = kNone;
  local_188.mMessage._M_string_length = 0;
  local_188.mMessage.field_2._M_local_buf[0] = '\0';
  local_188.mMessage._M_dataplus._M_p = (pointer)paVar1;
  testing::Return<ot::commissioner::Error>(local_230,&local_188);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_278,(ReturnAction *)local_230);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::WillOnce(this_00,(Action<ot::commissioner::Error_(unsigned_int,_unsigned_char,_unsigned_short,_unsigned_short,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_278);
  if ((_Manager_type)local_268._M_allocated_capacity != (_Manager_type)0x0) {
    (*(code *)local_268._M_allocated_capacity)(local_278,local_278,3);
  }
  if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.mMessage._M_dataplus._M_p != paVar1) {
    operator_delete(local_188.mMessage._M_dataplus._M_p);
  }
  local_1a0 = &PTR__MatcherBase_003a2aa0;
  if (local_190._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_190._M_pi);
  }
  local_1b8 = &PTR__MatcherBase_003a2b08;
  if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
  }
  local_1d0._M_allocated_capacity = (size_type)&PTR__MatcherBase_003a0a20;
  if (local_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0._M_pi);
  }
  local_1f0._8_8_ = &PTR__MatcherBase_003a0a20;
  if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
  }
  local_200._M_p = (pointer)&PTR__MatcherBase_003a0858;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1f0._1_7_,local_1f0[0]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_1f0._1_7_,local_1f0[0]));
  }
  local_220.
  super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_003a0858;
  if (local_220.
      super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_220.
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               .impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_290.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a0a20;
  if (local_290.super_MatcherBase<unsigned_short>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_290.super_MatcherBase<unsigned_short>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2c0.super_MatcherBase<unsigned_short>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a0a20;
  if (local_2c0.super_MatcherBase<unsigned_short>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c0.super_MatcherBase<unsigned_short>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2d8.super_MatcherBase<unsigned_char>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2b08;
  if (local_2d8.super_MatcherBase<unsigned_char>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d8.super_MatcherBase<unsigned_char>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2a8.super_MatcherBase<unsigned_int>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_003a2aa0;
  if (local_2a8.super_MatcherBase<unsigned_int>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.super_MatcherBase<unsigned_int>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_2d8.super_MatcherBase<unsigned_char>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2d8.super_MatcherBase<unsigned_char>._vptr_MatcherBase = (_func_int **)0x0;
  local_2d8.super_MatcherBase<unsigned_char>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_208._0_4_ = kNone;
  local_1f8 = (element_type *)0x0;
  local_1f0[0] = '\0';
  local_1d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d0._M_allocated_capacity = local_1d0._M_allocated_capacity & 0xffffffffffffff00;
  local_278._0_8_ = &local_268;
  local_200._M_p = local_1f0;
  local_1e0._M_p = (pointer)&local_1d0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_278,"energy scan 1 2 3 4 1234::5678","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2c0,&local_160.mInterpreter,(string *)local_278);
  local_2a8.super_MatcherBase<unsigned_int>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_2d8.super_MatcherBase<unsigned_char>.impl_.
       super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_2a8.super_MatcherBase<unsigned_int>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            local_2d8.super_MatcherBase<unsigned_char>.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_2a8.super_MatcherBase<unsigned_int>._vptr_MatcherBase =
       local_2d8.super_MatcherBase<unsigned_char>._vptr_MatcherBase;
  local_2d8.super_MatcherBase<unsigned_char>._vptr_MatcherBase =
       local_2c0.super_MatcherBase<unsigned_short>._vptr_MatcherBase;
  local_2d8.super_MatcherBase<unsigned_char>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            local_2c0.super_MatcherBase<unsigned_short>.impl_.
            super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_2d8.super_MatcherBase<unsigned_char>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_char_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_2c0.super_MatcherBase<unsigned_short>.impl_.
       super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  local_2c0.super_MatcherBase<unsigned_short>._vptr_MatcherBase = (_func_int **)0x0;
  local_2c0.super_MatcherBase<unsigned_short>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_2c0.super_MatcherBase<unsigned_short>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._0_8_ != &local_268) {
    operator_delete((void *)local_278._0_8_);
  }
  ot::commissioner::Interpreter::Eval
            ((Value *)local_278,&local_160.mInterpreter,(Expression *)&local_2d8);
  local_208._0_4_ = local_278._0_4_;
  std::__cxx11::string::operator=((string *)&local_200,(string *)(local_278 + 8));
  std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_250);
  if (local_250._M_p != local_240) {
    operator_delete(local_250._M_p);
  }
  if ((char *)local_278._8_8_ != local_268._M_local_buf + 8) {
    operator_delete((void *)local_278._8_8_);
  }
  bVar4 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_208);
  local_2a8.super_MatcherBase<unsigned_int>._vptr_MatcherBase =
       (_func_int **)
       CONCAT71(local_2a8.super_MatcherBase<unsigned_int>._vptr_MatcherBase._1_7_,bVar4);
  local_2a8.super_MatcherBase<unsigned_int>.impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_2c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_278,(internal *)&local_2a8,(AssertionResult *)0x2e6ffe,"false","true"
               ,(char *)gmock_a3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x861,(char *)local_278._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._0_8_ != &local_268) {
      operator_delete((void *)local_278._0_8_);
    }
    if (local_2c0.super_MatcherBase<unsigned_short>._vptr_MatcherBase != (_func_int **)0x0) {
      (**(code **)(*local_2c0.super_MatcherBase<unsigned_short>._vptr_MatcherBase + 8))();
    }
  }
  peVar3 = local_2a8.super_MatcherBase<unsigned_int>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (local_2a8.super_MatcherBase<unsigned_int>.impl_.
      super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    peVar2 = (element_type *)
             ((local_2a8.super_MatcherBase<unsigned_int>.impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface;
    if (peVar2 != local_2a8.super_MatcherBase<unsigned_int>.impl_.
                  super___shared_ptr<const_testing::MatcherInterface<const_unsigned_int_&>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 2) {
      operator_delete(peVar2);
    }
    operator_delete(peVar3);
  }
  if ((element_type *)local_1e0._M_p != (element_type *)&local_1d0) {
    operator_delete(local_1e0._M_p);
  }
  if (local_200._M_p != local_1f0) {
    operator_delete(local_200._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_EnergyScan)
{
    TestContext ctx;
    InitContext(ctx);

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, EnergyScan(_, _, _, _, _)).WillOnce(Return(Error{}));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("energy scan 1 2 3 4 1234::5678");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}